

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void speak_sync(OpenJTalk *oj)

{
  SpeakData *pSVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  PaStream *stream;
  PaStreamParameters outputParameters;
  undefined8 local_40;
  int local_38 [4];
  undefined8 local_28;
  undefined8 local_20;
  
  if (g_verbose) {
    speak_sync_cold_1();
  }
  pSVar1 = g_psd;
  g_psd->finished = false;
  pSVar1->stop = false;
  pSVar1->pause = false;
  pSVar1->speaking = false;
  pSVar1->paused = false;
  local_38[0] = Pa_GetDefaultOutputDevice();
  if (local_38[0] != -1) {
    local_38[1] = 1;
    local_38[2] = 8;
    local_38[3] = 0;
    lVar3 = Pa_GetDeviceInfo(local_38[0]);
    local_28 = *(undefined8 *)(lVar3 + 0x28);
    local_20 = 0;
    iVar2 = Pa_OpenStream(((double)CONCAT44(0x45300000,(int)(g_psd->sampling_frequency >> 0x20)) -
                          1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)g_psd->sampling_frequency) -
                          4503599627370496.0),&local_40,0,local_38,0x400,1,0,0);
    if (iVar2 == 0) {
      g_psd->speaking = true;
      iVar2 = Pa_StartStream(local_40);
      if (iVar2 == 0) {
        if (g_psd->length != 0) {
          uVar4 = 0x400;
          uVar5 = 0;
          do {
            if (g_psd->stop != false) break;
            iVar2 = Pa_WriteStream(local_40,g_psd->data + uVar5,0x400);
            if (iVar2 != 0) break;
            uVar5 = (ulong)uVar4;
            uVar4 = uVar4 + 0x400;
          } while (uVar5 < g_psd->length);
        }
        Pa_CloseStream(local_40);
      }
    }
  }
  if (g_psd->data != (short *)0x0) {
    free(g_psd->data);
    g_psd->data = (short *)0x0;
  }
  pSVar1 = g_psd;
  g_psd->finished = true;
  pSVar1->stop = false;
  pSVar1->pause = false;
  pSVar1->speaking = false;
  pSVar1->paused = false;
  if (g_verbose == true) {
    speak_sync_cold_2();
  }
  return;
}

Assistant:

void speak_sync(OpenJTalk *oj)
{
	if (g_verbose)
	{
		console_message(u8"同期発声開始\n");
	}

	g_psd->finished = false;
	g_psd->speaking = false;
	g_psd->pause = false;
	g_psd->paused = false;
	g_psd->stop = false;

	PaStreamParameters outputParameters;
	PaStream *stream;
	PaError err;

	outputParameters.device = Pa_GetDefaultOutputDevice();
	if (outputParameters.device == paNoDevice)
	{
		goto exit_func;
	}
	outputParameters.channelCount = 1;
	outputParameters.sampleFormat = paInt16;
	outputParameters.suggestedLatency = Pa_GetDeviceInfo(outputParameters.device)->defaultLowOutputLatency;
	outputParameters.hostApiSpecificStreamInfo = NULL;

	err = Pa_OpenStream(&stream, NULL, &outputParameters, (double)g_psd->sampling_frequency, OPENJTALK_BLOCKSIZE, paClipOff, NULL, NULL);
	if (err != paNoError)
	{
		goto exit_func;
	}

	g_psd->speaking = true;
	err = Pa_StartStream(stream);
	if (err != paNoError)
	{
		goto exit_func;
	}

	for (unsigned int i = 0; i * OPENJTALK_BLOCKSIZE < g_psd->length; i++)
	{
		if (g_psd->stop)
		{
			break;
		}

		err = Pa_WriteStream(stream, &g_psd->data[i * OPENJTALK_BLOCKSIZE], OPENJTALK_BLOCKSIZE);
		if (err != paNoError)
		{
			break;
		}
	}
	Pa_CloseStream(stream);

exit_func:
	if (g_psd->data)
	{
		free(g_psd->data);
		g_psd->data = NULL;
	}

	g_psd->finished = true;
	g_psd->speaking = false;
	g_psd->pause = false;
	g_psd->paused = false;
	g_psd->stop = false;

	if (g_verbose)
	{
		console_message(u8"同期発声完了\n");
	}
}